

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  ushort uVar1;
  uint j;
  long lVar2;
  size_type sVar3;
  value_type *__x;
  uint j_1;
  deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pdVar4;
  ulong n_00;
  uint i_2;
  uchar **__x_00;
  uint i;
  ulong uVar5;
  long lVar6;
  array<unsigned_short,_256UL> bucketsize;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  __x_00 = strings;
  for (uVar5 = 0; uVar5 < (n & 0xffffffffffffffe0); uVar5 = uVar5 + 0x20) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      *(uchar *)((long)bucketsize._M_elems + lVar2) = __x_00[lVar2][depth];
    }
    __x = __x_00;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (buckets + *(byte *)((long)bucketsize._M_elems + lVar2),__x);
      __x = __x + 1;
    }
    __x_00 = __x_00 + 0x20;
  }
  for (; uVar5 < n; uVar5 = uVar5 + 1) {
    std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              (buckets + (*__x_00)[depth],__x_00);
    __x_00 = __x_00 + 1;
  }
  pdVar4 = buckets;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    sVar3 = std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(pdVar4);
    bucketsize._M_elems[lVar2] = (unsigned_short)sVar3;
    pdVar4 = pdVar4 + 1;
  }
  lVar2 = 0;
  pdVar4 = buckets;
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    uVar1 = bucketsize._M_elems[lVar6];
    if ((ulong)uVar1 != 0) {
      copy<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char**>
                (pdVar4,strings + lVar2);
      lVar2 = lVar2 + (ulong)uVar1;
    }
    pdVar4 = pdVar4 + 1;
  }
  for (lVar2 = 0; lVar2 != 0x5000; lVar2 = lVar2 + 0x50) {
    std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear
              ((deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
               ((long)&(buckets->
                       super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                       .super__Deque_impl_data._M_map + lVar2));
  }
  uVar5 = (ulong)bucketsize._M_elems[0];
  for (lVar2 = 1; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    n_00 = (ulong)bucketsize._M_elems[lVar2];
    if (n_00 != 0) {
      msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                (strings + uVar5,n_00,depth + 1,buckets);
      uVar5 = uVar5 + n_00;
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}